

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

int __thiscall NodeBTree::equalKeyCompareOp(NodeBTree *this,KeyType *key,uint8_t *data)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uchar **in_RDX;
  NodeKey *in_RSI;
  uint32_t nodeIndex;
  uchar flags;
  int local_4;
  
  readNext<unsigned_char,unsigned_char>(in_RDX);
  uVar2 = decodeBitsAndAdvance((uint8_t **)&stack0xffffffffffffffe0);
  uVar1 = NodeKey::nodeIndex(in_RSI);
  if (uVar1 < (uint)uVar2) {
    local_4 = -1;
  }
  else {
    uVar1 = NodeKey::nodeIndex(in_RSI);
    if ((uint)uVar2 < uVar1) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int equalKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto flags = readNext<uint8_t>(data);
		UNUSED(flags);

		const auto nodeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.nodeIndex() < nodeIndex)
			return -1;
		else if (key.nodeIndex() > nodeIndex)
			return 1;

		return 0;
	}